

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O1

void test_sections_29(void)

{
  run("standalone lines should be removed from the template",
      "| This Is\n{{#boolean}}\n|\n{{/boolean}}\n| A Line\n","{\"boolean\": true}",(char *)0x0,
      "| This Is\n|\n| A Line\n");
  return;
}

Assistant:

static void
test_sections_29(void)
{
    run(
        "standalone lines should be removed from the template",
        "| This Is\n{{#boolean}}\n|\n{{/boolean}}\n| A Line\n",
        "{\"boolean\": true}",
        NULL,
        "| This Is\n|\n| A Line\n"
    );
}